

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O1

void __thiscall
jrtplib::RTPSources::BYETimeout(RTPSources *this,RTPTime *curtime,RTPTime *timeoutdelay)

{
  RTPTime *pRVar1;
  byte bVar2;
  RTPInternalSourceData *pRVar3;
  HashElement *pHVar4;
  RTPMemoryManager *pRVar5;
  HashElement *pHVar6;
  HashElement *pHVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  double dVar11;
  
  dVar11 = curtime->m_t - timeoutdelay->m_t;
  pHVar6 = (this->sourcelist).firsthashelem;
  (this->sourcelist).curhashelem = pHVar6;
  if (pHVar6 == (HashElement *)0x0) {
    iVar10 = 0;
    iVar8 = 0;
    iVar9 = 0;
  }
  else {
    iVar9 = 0;
    iVar8 = 0;
    iVar10 = 0;
    do {
      pRVar3 = pHVar6->element;
      if ((pRVar3->super_RTPSourceData).receivedbye == true) {
        if ((pRVar3 == this->owndata) ||
           (pRVar1 = &(pRVar3->super_RTPSourceData).byetime,
           dVar11 < pRVar1->m_t || dVar11 == pRVar1->m_t)) {
          bVar2 = (pRVar3->super_RTPSourceData).issender;
          goto LAB_00129d14;
        }
        this->totalcount = this->totalcount + -1;
        if ((pRVar3->super_RTPSourceData).issender == true) {
          this->sendercount = this->sendercount + -1;
        }
        if (((pRVar3->super_RTPSourceData).validated == true) &&
           (((pRVar3->super_RTPSourceData).receivedbye & 1U) == 0)) {
          this->activecount = this->activecount + -1;
        }
        pHVar7 = pHVar6->hashprev;
        pHVar4 = pHVar6->hashnext;
        if (pHVar7 == (HashElement *)0x0) {
          (this->sourcelist).table[pHVar6->hashindex] = pHVar4;
          if (pHVar4 != (HashElement *)0x0) {
            pHVar7 = (HashElement *)0x0;
            goto LAB_00129d43;
          }
        }
        else {
          pHVar7->hashnext = pHVar4;
          if (pHVar4 != (HashElement *)0x0) {
LAB_00129d43:
            pHVar4->hashprev = pHVar7;
          }
        }
        pHVar6 = (this->sourcelist).curhashelem;
        pHVar7 = pHVar6->listprev;
        pHVar4 = pHVar6->listnext;
        if (pHVar7 == (HashElement *)0x0) {
          (this->sourcelist).firsthashelem = pHVar4;
          if (pHVar4 == (HashElement *)0x0) {
            (this->sourcelist).lasthashelem = (HashElement *)0x0;
          }
          else {
            pHVar4->listprev = (HashElement *)0x0;
          }
        }
        else {
          pHVar7->listnext = pHVar4;
          if (pHVar4 == (HashElement *)0x0) {
            (this->sourcelist).lasthashelem = pHVar7;
          }
          else {
            pHVar4->listprev = pHVar7;
          }
        }
        pRVar5 = (this->sourcelist).super_RTPMemoryObject.mgr;
        if (pRVar5 == (RTPMemoryManager *)0x0) {
          if (pHVar6 != (HashElement *)0x0) {
            operator_delete(pHVar6,0x30);
          }
        }
        else {
          (**(code **)(*(long *)pRVar5 + 0x18))(pRVar5,pHVar6);
        }
        (this->sourcelist).curhashelem = pHVar4;
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[9])(this,pRVar3);
        (*(this->super_RTPMemoryObject)._vptr_RTPMemoryObject[7])(this,pRVar3);
        pRVar5 = (this->super_RTPMemoryObject).mgr;
        if (pRVar5 == (RTPMemoryManager *)0x0) {
          if (pRVar3 != (RTPInternalSourceData *)0x0) {
            (*(pRVar3->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject[1])(pRVar3);
          }
        }
        else {
          (**(pRVar3->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject)(pRVar3);
          (**(code **)(*(long *)pRVar5 + 0x18))(pRVar5,pRVar3);
        }
      }
      else {
        bVar2 = (pRVar3->super_RTPSourceData).issender;
        iVar8 = iVar8 + (uint)(pRVar3->super_RTPSourceData).validated;
LAB_00129d14:
        iVar10 = iVar10 + (uint)bVar2;
        iVar9 = iVar9 + 1;
        (this->sourcelist).curhashelem = pHVar6->listnext;
      }
      pHVar6 = (this->sourcelist).curhashelem;
    } while (pHVar6 != (HashElement *)0x0);
  }
  this->totalcount = iVar9;
  this->sendercount = iVar10;
  this->activecount = iVar8;
  return;
}

Assistant:

void RTPSources::BYETimeout(const RTPTime &curtime,const RTPTime &timeoutdelay)
{
	int newtotalcount = 0;
	int newsendercount = 0;
	int newactivecount = 0;
	RTPTime checktime = curtime;
	checktime -= timeoutdelay;
	
	sourcelist.GotoFirstElement();
	while (sourcelist.HasCurrentElement())
	{
		RTPInternalSourceData *srcdat = sourcelist.GetCurrentElement();
		
		if (srcdat->ReceivedBYE())
		{
			RTPTime byetime = srcdat->GetBYETime();

			if ((srcdat != owndata) && (checktime > byetime))
			{
				totalcount--;
				if (srcdat->IsSender())
					sendercount--;
				if (srcdat->IsActive())
					activecount--;
				sourcelist.DeleteCurrentElement();
				OnBYETimeout(srcdat);
				OnRemoveSource(srcdat);
				RTPDelete(srcdat,GetMemoryManager());
			}
			else
			{
				newtotalcount++;
				if (srcdat->IsSender())
					newsendercount++;
				if (srcdat->IsActive())
					newactivecount++;
				sourcelist.GotoNextElement();
			}
		}
		else
		{
			newtotalcount++;
			if (srcdat->IsSender())
				newsendercount++;
			if (srcdat->IsActive())
				newactivecount++;
			sourcelist.GotoNextElement();
		}
	}
	
#ifdef RTPDEBUG
	if (newtotalcount != totalcount)
	{
		std::cout << "New total count " << newtotalcount << " doesnt match old total count " << totalcount << std::endl;
		SafeCountTotal();
	}
	if (newsendercount != sendercount)
	{
		std::cout << "New sender count " << newsendercount << " doesnt match old sender count " << sendercount << std::endl;
		SafeCountSenders();
	}
	if (newactivecount != activecount)
	{
		std::cout << "New active count " << newactivecount << " doesnt match old active count " << activecount << std::endl;
		SafeCountActive();
	}
#endif // RTPDEBUG
	
	totalcount = newtotalcount; // just to play it safe
	sendercount = newsendercount;
	activecount = newactivecount;
}